

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

uint decode_uid(char *s)

{
  ushort **ppuVar1;
  int *piVar2;
  ulong uVar3;
  char *in_RDI;
  uint v;
  uint local_4;
  
  if ((in_RDI == (char *)0x0) || (*in_RDI == '\0')) {
    local_4 = 0xffffffff;
  }
  else {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)*in_RDI] & 0x400) == 0) {
      piVar2 = __errno_location();
      *piVar2 = 0;
      uVar3 = strtoul(in_RDI,(char **)0x0,0);
      local_4 = (uint)uVar3;
      piVar2 = __errno_location();
      if (*piVar2 != 0) {
        local_4 = 0xffffffff;
      }
    }
    else {
      local_4 = android_name_to_id(in_RDI);
    }
  }
  return local_4;
}

Assistant:

unsigned int decode_uid(const char *s)
{
    unsigned int v;

    if (!s || *s == '\0')
        return -1U;
    if (isalpha(s[0]))
        return android_name_to_id(s);

    errno = 0;
    v = (unsigned int) strtoul(s, 0, 0);
    if (errno)
        return -1U;
    return v;
}